

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Decode_MismatchLengthAndDigestLength_Test::TestBody
          (Decode_MismatchLengthAndDigestLength_Test *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<optional<Multihash>,_optional<basic_string<char>_>_>_> *__args_1;
  Message *pMVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *in_R9;
  AssertHelper local_208;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__1;
  allocator<char> local_191;
  string local_190;
  ResMultihash local_170;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  type *optErr;
  type *_;
  allocator<char> local_89;
  string local_88;
  ResMultihash local_68;
  Decode_MismatchLengthAndDigestLength_Test *local_10;
  Decode_MismatchLengthAndDigestLength_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"02mydigest",&local_89);
  multihash::decode(&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  __args_1 = std::get<0ul,std::optional<multihash::Multihash>,std::optional<std::__cxx11::string>>
                       (&local_68);
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::get<1ul,std::optional<multihash::Multihash>,std::optional<std::__cxx11::string>>
                 (&local_68);
  testing::AssertionResult::AssertionResult<std::optional<std::__cxx11::string>>
            ((AssertionResult *)local_c0,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)gtest_ar_.message_.ptr_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pMVar2 = testing::Message::operator<<
                       (&local_c8,(char (*) [31])"Expected an error. expected: \'");
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               multihash::errInconsistantLength_abi_cxx11_);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x160304);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_c0,(AssertionResult *)"optErr","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0xb1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message(&local_c8);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    pbVar4 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(gtest_ar_.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_108,"multihash::errInconsistantLength","optErr.value()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               multihash::errInconsistantLength_abi_cxx11_,pbVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                 ,0xb2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message(&local_110);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"0999mydigest",&local_191);
      multihash::decode(&local_170,&local_190);
      std::tie<std::optional<multihash::Multihash>,std::optional<std::__cxx11::string>>
                ((optional<multihash::Multihash> *)&gtest_ar__1.message_,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)__args_1);
      std::tuple<std::optional<multihash::Multihash>&,std::optional<std::__cxx11::string>&>::
      operator=((tuple<std::optional<multihash::Multihash>&,std::optional<std::__cxx11::string>&> *)
                &gtest_ar__1.message_,&local_170);
      std::
      tuple<std::optional<multihash::Multihash>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~tuple(&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      testing::AssertionResult::AssertionResult<std::optional<std::__cxx11::string>>
                ((AssertionResult *)local_1b8,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)gtest_ar_.message_.ptr_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        pMVar2 = testing::Message::operator<<
                           (&local_1c0,(char (*) [31])"Expected an error. expected: \'");
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)multihash::errInconsistantLength_abi_cxx11_);
        pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x160304);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_1b8,(AssertionResult *)"optErr",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                   ,0xb5,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1c8,pMVar2);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_1c0);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        pbVar4 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(gtest_ar_.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                  ((EqHelper<false> *)local_1f8,"multihash::errInconsistantLength","optErr.value()",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multihash::errInconsistantLength_abi_cxx11_,pbVar4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_200);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_208,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                     ,0xb6,pcVar3);
          testing::internal::AssertHelper::operator=(&local_208,&local_200);
          testing::internal::AssertHelper::~AssertHelper(&local_208);
          testing::Message::~Message(&local_200);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          gtest_ar.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  std::
  tuple<std::optional<multihash::Multihash>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~tuple(&local_68);
  return;
}

Assistant:

TEST(Decode, MismatchLengthAndDigestLength) {
	auto [_, optErr] = multihash::decode("02mydigest");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errInconsistantLength << "'";
	ASSERT_EQ(multihash::errInconsistantLength, optErr.value());

	std::tie(_, optErr) = multihash::decode("0999mydigest");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errInconsistantLength << "'";
	ASSERT_EQ(multihash::errInconsistantLength, optErr.value());
}